

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Expression * __thiscall
soul::heart::Parser::checkExpressionType
          (Parser *this,Expression *r,Type *requiredType,CodeLocation *errorPos)

{
  uint64_t this_00 [1];
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string local_d8;
  CompileMessage local_b8;
  undefined4 local_80;
  undefined1 local_70 [8];
  Value constValue;
  CodeLocation *errorPos_local;
  Type *requiredType_local;
  Expression *r_local;
  Parser *this_local;
  
  constValue.allocatedData.allocatedData.space[0] = (uint64_t)errorPos;
  (*(r->super_Object)._vptr_Object[7])();
  bVar1 = soul::Value::isValid((Value *)local_70);
  if ((!bVar1) || (bVar1 = TypeRules::canSilentlyCastTo(requiredType,(Value *)local_70), !bVar1)) {
    iVar2 = (*(r->super_Object)._vptr_Object[2])();
    bVar1 = TypeRules::canPassAsArgumentTo(requiredType,(Type *)CONCAT44(extraout_var,iVar2),true);
    this_00[0] = constValue.allocatedData.allocatedData.space[0];
    if (!bVar1) {
      getTypeDescription_abi_cxx11_(&local_d8,this,requiredType);
      Errors::expectedExpressionOfType<std::__cxx11::string>(&local_b8,(Errors *)&local_d8,args);
      CodeLocation::throwError((CodeLocation *)this_00[0],&local_b8);
    }
  }
  local_80 = 1;
  soul::Value::~Value((Value *)local_70);
  return r;
}

Assistant:

heart::Expression& checkExpressionType (heart::Expression& r, const Type& requiredType, const CodeLocation& errorPos)
    {
        auto constValue = r.getAsConstant();

        if (constValue.isValid() && TypeRules::canSilentlyCastTo (requiredType, constValue))
            return r;

        if (! TypeRules::canPassAsArgumentTo (requiredType, r.getType(), true))
            errorPos.throwError (Errors::expectedExpressionOfType (getTypeDescription (requiredType)));

        return r;
    }